

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_handle_lifetime.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZESHandleLifetimeValidation::zesDriverEventListenExPrologue
          (ZESHandleLifetimeValidation *this,ze_driver_handle_t hDriver,uint64_t timeout,
          uint32_t count,zes_device_handle_t *phDevices,uint32_t *pNumDeviceEvents,
          zes_event_type_flags_t *pEvents)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  ze_result_t zVar4;
  ulong uVar5;
  ze_driver_handle_t local_38;
  
  lVar1 = context;
  local_38 = hDriver;
  iVar2 = std::
          _Hashtable<_ze_driver_handle_t_*,_std::pair<_ze_driver_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_driver_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_driver_handle_t_*>,_std::hash<_ze_driver_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<_ze_driver_handle_t_*,_std::pair<_ze_driver_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_driver_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_driver_handle_t_*>,_std::hash<_ze_driver_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(context + 0xd48) + 0x88),&local_38);
  zVar4 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (iVar2.
      super__Node_iterator_base<std::pair<_ze_driver_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    if (count != 0 && phDevices != (zes_device_handle_t *)0x0) {
      uVar5 = 0;
      do {
        local_38 = (ze_driver_handle_t)phDevices[uVar5];
        iVar3 = std::
                _Hashtable<_ze_device_handle_t_*,_std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_device_handle_t_*>,_std::hash<_ze_device_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<_ze_device_handle_t_*,_std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_device_handle_t_*>,_std::hash<_ze_device_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(*(long *)(lVar1 + 0xd48) + 0xc0),(key_type *)&local_38);
        if (iVar3.
            super__Node_iterator_base<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < count);
    }
    zVar4 = ZE_RESULT_SUCCESS;
  }
  return zVar4;
}

Assistant:

ze_result_t
    ZESHandleLifetimeValidation::zesDriverEventListenExPrologue(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint64_t timeout,                               ///< [in] if non-zero, then indicates the maximum time (in milliseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then will check status and return immediately;
                                                        ///< if `UINT64_MAX`, then function will not return until events arrive.
        uint32_t count,                                 ///< [in] Number of device handles in phDevices.
        zes_device_handle_t* phDevices,                 ///< [in][range(0, count)] Device handles to listen to for events. Only
                                                        ///< devices from the provided driver handle can be specified in this list.
        uint32_t* pNumDeviceEvents,                     ///< [in,out] Will contain the actual number of devices in phDevices that
                                                        ///< generated events. If non-zero, check pEvents to determine the devices
                                                        ///< and events that were received.
        zes_event_type_flags_t* pEvents                 ///< [in,out] An array that will continue the list of events for each
                                                        ///< device listened in phDevices.
                                                        ///< This array must be at least as big as count.
                                                        ///< For every device handle in phDevices, this will provide the events
                                                        ///< that occurred for that device at the same position in this array. If
                                                        ///< no event was received for a given device, the corresponding array
                                                        ///< entry will be zero.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hDriver )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phDevices) && (i < count); ++i){
            if (!context.handleLifetime->isHandleValid( phDevices[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }